

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O0

int mod_mul_consttime(BIGNUM *r,BIGNUM *a,BIGNUM *b,BN_MONT_CTX *mont,BN_CTX *ctx)

{
  int iVar1;
  BIGNUM *a_00;
  bool local_41;
  BIGNUM *tmp;
  BN_CTXScope scope;
  BN_CTX *ctx_local;
  BN_MONT_CTX *mont_local;
  BIGNUM *b_local;
  BIGNUM *a_local;
  BIGNUM *r_local;
  
  scope.ctx_ = ctx;
  bssl::BN_CTXScope::BN_CTXScope((BN_CTXScope *)&tmp,ctx);
  a_00 = BN_CTX_get((BN_CTX *)scope.ctx_);
  local_41 = false;
  if (a_00 != (BIGNUM *)0x0) {
    iVar1 = BN_to_montgomery((BIGNUM *)a_00,a,mont,scope.ctx_);
    local_41 = false;
    if (iVar1 != 0) {
      iVar1 = BN_mod_mul_montgomery
                        ((BIGNUM *)r,a_00,(BIGNUM *)b,(BN_MONT_CTX *)mont,(BN_CTX *)scope.ctx_);
      local_41 = iVar1 != 0;
    }
  }
  bssl::BN_CTXScope::~BN_CTXScope((BN_CTXScope *)&tmp);
  return (uint)local_41;
}

Assistant:

static int mod_mul_consttime(BIGNUM *r, const BIGNUM *a, const BIGNUM *b,
                             const BN_MONT_CTX *mont, BN_CTX *ctx) {
  bssl::BN_CTXScope scope(ctx);
  BIGNUM *tmp = BN_CTX_get(ctx);
  // |BN_mod_mul_montgomery| removes a factor of R, so we cancel it with a
  // single |BN_to_montgomery| which adds one factor of R.
  return tmp != nullptr &&  //
         BN_to_montgomery(tmp, a, mont, ctx) &&
         BN_mod_mul_montgomery(r, tmp, b, mont, ctx);
}